

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

bool __thiscall ftxui::HorizontalContainer::EventHandler(HorizontalContainer *this,Event *event)

{
  bool bVar1;
  size_type sVar2;
  int *piVar3;
  bool local_d2;
  bool local_b5;
  int local_b4 [2];
  byte local_a9;
  Event local_a8;
  byte local_61;
  Event local_60;
  int local_1c;
  Event *pEStack_18;
  int old_selected;
  Event *event_local;
  HorizontalContainer *this_local;
  
  local_1c = *(this->super_ContainerBase).selector_;
  pEStack_18 = event;
  event_local = (Event *)this;
  bVar1 = Event::operator==(event,(Event *)Event::ArrowLeft);
  local_61 = 0;
  local_b5 = true;
  if (!bVar1) {
    Event::Character(&local_60,'h');
    local_61 = 1;
    local_b5 = Event::operator==(event,&local_60);
  }
  if ((local_61 & 1) != 0) {
    Event::~Event(&local_60);
  }
  if (local_b5 != false) {
    ftxui::ContainerBase::MoveSelector(&this->super_ContainerBase,-1);
  }
  bVar1 = Event::operator==(event,(Event *)Event::ArrowRight);
  local_a9 = 0;
  local_d2 = true;
  if (!bVar1) {
    Event::Character(&local_a8,'l');
    local_a9 = 1;
    local_d2 = Event::operator==(event,&local_a8);
  }
  if ((local_a9 & 1) != 0) {
    Event::~Event(&local_a8);
  }
  if (local_d2 != false) {
    ftxui::ContainerBase::MoveSelector(&this->super_ContainerBase,1);
  }
  bVar1 = Event::operator==(event,(Event *)Event::Tab);
  if ((bVar1) &&
     (sVar2 = std::
              vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
              ::size(&(this->super_ContainerBase).super_ComponentBase.children_), sVar2 != 0)) {
    ftxui::ContainerBase::MoveSelectorWrap(&this->super_ContainerBase,1);
  }
  bVar1 = Event::operator==(event,(Event *)Event::TabReverse);
  if ((bVar1) &&
     (sVar2 = std::
              vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
              ::size(&(this->super_ContainerBase).super_ComponentBase.children_), sVar2 != 0)) {
    ftxui::ContainerBase::MoveSelectorWrap(&this->super_ContainerBase,-1);
  }
  local_b4[1] = 0;
  sVar2 = std::
          vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
          ::size(&(this->super_ContainerBase).super_ComponentBase.children_);
  local_b4[0] = (int)sVar2 + -1;
  piVar3 = std::min<int>(local_b4,(this->super_ContainerBase).selector_);
  piVar3 = std::max<int>(local_b4 + 1,piVar3);
  *(this->super_ContainerBase).selector_ = *piVar3;
  return local_1c != *(this->super_ContainerBase).selector_;
}

Assistant:

bool EventHandler(Event event) override {
    int old_selected = *selector_;
    if (event == Event::ArrowLeft || event == Event::Character('h'))
      MoveSelector(-1);
    if (event == Event::ArrowRight || event == Event::Character('l'))
      MoveSelector(+1);
    if (event == Event::Tab && children_.size())
      MoveSelectorWrap(+1);
    if (event == Event::TabReverse && children_.size())
      MoveSelectorWrap(-1);

    *selector_ = std::max(0, std::min(int(children_.size()) - 1, *selector_));
    return old_selected != *selector_;
  }